

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

bool s2textformat::MakeIndex
               (string_view str,
               unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *index)

{
  MutableS2ShapeIndex *this;
  undefined8 uVar1;
  ostream *poVar2;
  Vector3<double> *pVVar3;
  bool bVar4;
  size_type sVar5;
  char separator;
  undefined8 in_R8;
  string_view *point_str;
  pointer psVar6;
  pointer psVar7;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view piece;
  S2Point point;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<absl::string_view,_std::allocator<absl::string_view>_> strs;
  _Head_base<0UL,_S2Shape_*,_false> local_c0;
  _Head_base<0UL,_S2Shape_*,_false> local_b8;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_b0;
  S2Point local_98;
  S2LogMessage local_78;
  Vector3<double> *local_68;
  _Head_base<0UL,_S2Shape_*,_false> local_60;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_58;
  string_view local_40;
  
  local_40.length_ = str.length_;
  local_40.ptr_ = str.ptr_;
  absl::StrSplit<absl::string_view>(&local_58,&local_40,'#');
  if ((long)local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x30) {
    sVar5 = 3;
    S2LogMessage::S2LogMessage
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.stream_,"Check failed: (3) == (strs.size()) ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.stream_,"Must contain two # characters: ",0x1f);
    piece.length_ = sVar5;
    piece.ptr_ = (char *)local_40.length_;
    absl::operator<<((absl *)local_78.stream_,(ostream *)local_40.ptr_,piece);
    abort();
  }
  local_78._0_8_ = (ostream *)0x0;
  local_78.stream_ = (ostream *)0x0;
  local_68 = (Vector3<double> *)0x0;
  str_00.length_ = 0x7c;
  str_00.ptr_ = (char *)(local_58.
                         super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                         _M_impl.super__Vector_impl_data._M_start)->length_;
  SplitString(&local_b0,
              (s2textformat *)
              (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
               _M_impl.super__Vector_impl_data._M_start)->ptr_,str_00,(char)in_R8);
  psVar7 = local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar6 = local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_98.c_[0] = 0.0;
      local_98.c_[1] = 0.0;
      local_98.c_[2] = 0.0;
      bVar4 = MakePoint(*psVar6,&local_98);
      if (!bVar4) goto LAB_0022a77b;
      if (local_78.stream_ == (ostream *)local_68) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_78,
                   (iterator)local_78.stream_,&local_98);
      }
      else {
        (&(local_78.stream_)->_vptr_basic_ostream)[2] = (_func_int **)local_98.c_[2];
        (local_78.stream_)->_vptr_basic_ostream = (_func_int **)local_98.c_[0];
        (&(local_78.stream_)->_vptr_basic_ostream)[1] = (_func_int **)local_98.c_[1];
        local_78.stream_ = (ostream *)((long)local_78.stream_ + 0x18);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar7);
  }
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  poVar2 = local_78.stream_;
  uVar1 = local_78._0_8_;
  if ((ostream *)local_78._0_8_ != local_78.stream_) {
    this = (index->_M_t).
           super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>.
           _M_t.
           super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>.
           super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl;
    local_60._M_head_impl = (S2Shape *)operator_new(0x28);
    pVVar3 = local_68;
    local_78._0_8_ = (ostream *)0x0;
    local_78.stream_ = (ostream *)0x0;
    local_68 = (Vector3<double> *)0x0;
    (local_60._M_head_impl)->id_ = -1;
    (local_60._M_head_impl)->_vptr_S2Shape = (_func_int **)&PTR__S2PointVectorShape_002bd378;
    local_60._M_head_impl[1]._vptr_S2Shape = (_func_int **)uVar1;
    *(ostream **)&local_60._M_head_impl[1].id_ = poVar2;
    local_60._M_head_impl[2]._vptr_S2Shape = (_func_int **)pVVar3;
    MutableS2ShapeIndex::Add(this,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_60);
    if (local_60._M_head_impl != (S2Shape *)0x0) {
      (*(local_60._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_60._M_head_impl = (S2Shape *)0x0;
  }
  str_01.length_ = 0x7c;
  str_01.ptr_ = (char *)local_58.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].length_;
  SplitString(&local_b0,
              (s2textformat *)
              local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
              _M_impl.super__Vector_impl_data._M_start[1].ptr_,str_01,(char)in_R8);
  psVar7 = local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  separator = (char)in_R8;
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar6 = local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_98.c_[0] = 0.0;
      bVar4 = MakeLaxPolyline(*psVar6,(unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                                       *)&local_98);
      if (!bVar4) {
        if ((S2Shape *)local_98.c_[0] != (S2Shape *)0x0) {
          (*(*(_func_int ***)local_98.c_[0])[1])();
        }
LAB_0022a77b:
        if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_start != (string_view *)0x0) {
          operator_delete(local_b0.
                          super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        bVar4 = false;
        goto LAB_0022a7b5;
      }
      local_b8._M_head_impl = (S2Shape *)local_98.c_[0];
      MutableS2ShapeIndex::Add
                ((index->_M_t).
                 super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
                 .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
                 (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_b8);
      if (local_b8._M_head_impl != (S2Shape *)0x0) {
        (*(local_b8._M_head_impl)->_vptr_S2Shape[1])();
      }
      separator = (char)in_R8;
      local_b8._M_head_impl = (S2Shape *)0x0;
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar7);
  }
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  str_02.length_ = 0x7c;
  str_02.ptr_ = (char *)local_58.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start[2].length_;
  SplitString(&local_b0,
              (s2textformat *)
              local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
              _M_impl.super__Vector_impl_data._M_start[2].ptr_,str_02,separator);
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = true;
  }
  else {
    psVar7 = local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_98.c_[0] = 0.0;
      bVar4 = MakeLaxPolygon(*psVar7,(unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                      *)&local_98);
      if (!bVar4) {
        if ((S2Shape *)local_98.c_[0] != (S2Shape *)0x0) {
          (*(*(_func_int ***)local_98.c_[0])[1])();
        }
        break;
      }
      local_c0._M_head_impl = (S2Shape *)local_98.c_[0];
      MutableS2ShapeIndex::Add
                ((index->_M_t).
                 super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
                 .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
                 (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_c0);
      if (local_c0._M_head_impl != (S2Shape *)0x0) {
        (*(local_c0._M_head_impl)->_vptr_S2Shape[1])();
      }
      local_c0._M_head_impl = (S2Shape *)0x0;
      psVar7 = psVar7 + 1;
    } while (psVar7 != local_b0.
                       super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_b0.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0022a7b5:
  if ((ostream *)local_78._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool MakeIndex(string_view str, std::unique_ptr<MutableS2ShapeIndex>* index) {
  vector<string_view> strs = absl::StrSplit(str, '#');
  S2_DCHECK_EQ(3, strs.size()) << "Must contain two # characters: " << str;

  vector<S2Point> points;
  for (const auto& point_str : SplitString(strs[0], '|')) {
    S2Point point;
    if (!MakePoint(point_str, &point)) return false;
    points.push_back(point);
  }
  if (!points.empty()) {
    (*index)->Add(make_unique<S2PointVectorShape>(std::move(points)));
  }
  for (const auto& line_str : SplitString(strs[1], '|')) {
    std::unique_ptr<S2LaxPolylineShape> lax_polyline;
    if (!MakeLaxPolyline(line_str, &lax_polyline)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polyline.release()));
  }
  for (const auto& polygon_str : SplitString(strs[2], '|')) {
    std::unique_ptr<S2LaxPolygonShape> lax_polygon;
    if (!MakeLaxPolygon(polygon_str, &lax_polygon)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polygon.release()));
  }
  return true;
}